

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O3

void helper_sve2_pmull_h_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t result;
  ulong uVar6;
  
  bVar1 = (byte)((int)desc >> 7);
  uVar4 = 0;
  do {
    uVar5 = *(ulong *)((long)vn + uVar4 * 8) >> (bVar1 & 0x38) & 0xff00ff00ff00ff;
    uVar2 = *(ulong *)((long)vm + uVar4 * 8) >> (bVar1 & 0x38) & 0xff00ff00ff00ff;
    iVar3 = 8;
    uVar6 = 0;
    do {
      uVar6 = uVar6 ^ (uVar5 & 0x1000100010001) * 0xffff & uVar2;
      uVar5 = uVar5 >> 1;
      uVar2 = uVar2 * 2;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    *(ulong *)((long)vd + uVar4 * 8) = uVar6;
    uVar4 = uVar4 + 1;
  } while (uVar4 != (desc & 0x1f) * 8 + 8 >> 3);
  return;
}

Assistant:

void HELPER(sve2_pmull_h)(void *vd, void *vn, void *vm, uint32_t desc)
{
    int shift = simd_data(desc) * 8;
    intptr_t i, opr_sz = simd_oprsz(desc);
    uint64_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; ++i) {
        uint64_t nn = (n[i] >> shift) & 0x00ff00ff00ff00ffull;
        uint64_t mm = (m[i] >> shift) & 0x00ff00ff00ff00ffull;

        d[i] = pmull_h(nn, mm);
    }
}